

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O3

void av1_filter_block_plane_horz
               (AV1_COMMON *cm,MACROBLOCKD *xd,int plane,MACROBLOCKD_PLANE *plane_ptr,
               uint32_t mi_row,uint32_t mi_col)

{
  undefined1 use_filter_type;
  int dst_stride;
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint8_t *dst;
  int iVar8;
  uint32_t curr_x;
  ulong local_90;
  AV1_DEBLOCKING_PARAMETERS params;
  
  bVar3 = (byte)plane_ptr->subsampling_y;
  bVar4 = (byte)plane_ptr->subsampling_x;
  uVar6 = (((1 << (bVar3 & 0x1f)) >> 1) + (cm->mi_params).mi_rows >> (bVar3 & 0x1f)) -
          (mi_row >> (bVar3 & 0x1f));
  uVar7 = 0x20 >> (bVar3 & 0x1f);
  if ((int)uVar6 < (int)uVar7) {
    uVar7 = uVar6;
  }
  uVar5 = (((1 << (bVar4 & 0x1f)) >> 1) + (cm->mi_params).mi_cols >> (bVar4 & 0x1f)) -
          (mi_col >> (bVar4 & 0x1f));
  uVar6 = 0x20 >> (bVar4 & 0x1f);
  if ((int)uVar5 < (int)uVar6) {
    uVar6 = uVar5;
  }
  if (0 < (int)uVar6) {
    puVar1 = (plane_ptr->dst).buf;
    dst_stride = (plane_ptr->dst).stride;
    local_90 = 0;
    do {
      if (0 < (int)uVar7) {
        dst = puVar1 + local_90 * 4;
        iVar8 = 0;
        do {
          params.filter_length = '\0';
          params._1_7_ = 0;
          params.lfthr = (loop_filter_thresh *)0x0;
          bVar2 = set_lpf_parameters(&params,(long)((cm->mi_params).mi_stride << (bVar3 & 0x1f)),cm,
                                     xd,'\x01',(int)local_90 * 4 + ((mi_col << 2) >> (bVar4 & 0x1f))
                                     ,((mi_row << 2) >> (bVar3 & 0x1f)) + iVar8 * 4,plane,plane_ptr)
          ;
          if (bVar2 == 0xff) {
            params._0_8_ = params._0_8_ & 0xffffffffffffff00;
            bVar2 = 0;
          }
          use_filter_type = cm->seq_params->use_highbitdepth;
          filter_horz(dst,dst_stride,&params,(SequenceHeader *)(ulong)cm->seq_params->bit_depth,
                      use_filter_type);
          iVar8 = iVar8 + tx_size_high_unit[bVar2];
          dst = dst + (uint)(tx_size_high_unit[bVar2] * dst_stride * 4);
        } while (iVar8 < (int)uVar7);
      }
      local_90 = local_90 + 1;
    } while (local_90 != uVar6);
  }
  return;
}

Assistant:

void av1_filter_block_plane_horz(const AV1_COMMON *const cm,
                                 const MACROBLOCKD *const xd, const int plane,
                                 const MACROBLOCKD_PLANE *const plane_ptr,
                                 const uint32_t mi_row, const uint32_t mi_col) {
  const uint32_t scale_horz = plane_ptr->subsampling_x;
  const uint32_t scale_vert = plane_ptr->subsampling_y;
  uint8_t *const dst_ptr = plane_ptr->dst.buf;
  const int dst_stride = plane_ptr->dst.stride;
  const int plane_mi_rows =
      ROUND_POWER_OF_TWO(cm->mi_params.mi_rows, scale_vert);
  const int plane_mi_cols =
      ROUND_POWER_OF_TWO(cm->mi_params.mi_cols, scale_horz);
  const int y_range = AOMMIN((int)(plane_mi_rows - (mi_row >> scale_vert)),
                             (MAX_MIB_SIZE >> scale_vert));
  const int x_range = AOMMIN((int)(plane_mi_cols - (mi_col >> scale_horz)),
                             (MAX_MIB_SIZE >> scale_horz));
  for (int x = 0; x < x_range; x++) {
    uint8_t *p = dst_ptr + x * MI_SIZE;
    for (int y = 0; y < y_range;) {
      // inner loop always filter vertical edges in a MI block. If MI size
      // is 8x8, it will first filter the vertical edge aligned with a 8x8
      // block. If 4x4 transform is used, it will then filter the internal
      // edge aligned with a 4x4 block
      const uint32_t curr_x = ((mi_col * MI_SIZE) >> scale_horz) + x * MI_SIZE;
      const uint32_t curr_y = ((mi_row * MI_SIZE) >> scale_vert) + y * MI_SIZE;
      uint32_t advance_units;
      TX_SIZE tx_size;
      AV1_DEBLOCKING_PARAMETERS params;
      memset(&params, 0, sizeof(params));

      tx_size = set_lpf_parameters(
          &params, (cm->mi_params.mi_stride << scale_vert), cm, xd, HORZ_EDGE,
          curr_x, curr_y, plane, plane_ptr);
      if (tx_size == TX_INVALID) {
        params.filter_length = 0;
        tx_size = TX_4X4;
      }

      filter_horz(p, dst_stride, &params, cm->seq_params, USE_SINGLE);

      // advance the destination pointer
      advance_units = tx_size_high_unit[tx_size];
      y += advance_units;
      p += advance_units * dst_stride * MI_SIZE;
    }
  }
}